

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SscWriterGeneric.cpp
# Opt level: O1

StepStatus __thiscall
adios2::core::engine::ssc::SscWriterGeneric::BeginStep
          (SscWriterGeneric *this,StepMode mode,float timeoutSeconds,bool writerLocked)

{
  int64_t *piVar1;
  pointer pvVar2;
  pointer pvVar3;
  pointer ppoVar4;
  pointer pvVar5;
  
  this->m_WriterDefinitionsLocked = writerLocked;
  if (((this->super_SscWriterBase).m_Threading == true) &&
     ((this->m_EndStepThread)._M_id._M_thread != 0)) {
    std::thread::join();
  }
  piVar1 = &(this->super_SscWriterBase).m_CurrentStep;
  *piVar1 = *piVar1 + 1;
  if (((*piVar1 == 0) || (this->m_WriterDefinitionsLocked == false)) ||
     (this->m_ReaderSelectionsLocked == false)) {
    Buffer::resize(&(this->super_SscWriterBase).m_Buffer,1);
    *(this->super_SscWriterBase).m_Buffer.m_Buffer = '\0';
    pvVar2 = (this->m_GlobalWritePattern).
             super__Vector_base<std::vector<adios2::core::engine::ssc::BlockInfo,_std::allocator<adios2::core::engine::ssc::BlockInfo>_>,_std::allocator<std::vector<adios2::core::engine::ssc::BlockInfo,_std::allocator<adios2::core::engine::ssc::BlockInfo>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pvVar3 = (this->m_GlobalWritePattern).
             super__Vector_base<std::vector<adios2::core::engine::ssc::BlockInfo,_std::allocator<adios2::core::engine::ssc::BlockInfo>_>,_std::allocator<std::vector<adios2::core::engine::ssc::BlockInfo,_std::allocator<adios2::core::engine::ssc::BlockInfo>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    pvVar5 = pvVar2;
    if (pvVar3 != pvVar2) {
      do {
        std::
        vector<adios2::core::engine::ssc::BlockInfo,_std::allocator<adios2::core::engine::ssc::BlockInfo>_>
        ::~vector(pvVar5);
        pvVar5 = pvVar5 + 1;
      } while (pvVar5 != pvVar3);
      (this->m_GlobalWritePattern).
      super__Vector_base<std::vector<adios2::core::engine::ssc::BlockInfo,_std::allocator<adios2::core::engine::ssc::BlockInfo>_>,_std::allocator<std::vector<adios2::core::engine::ssc::BlockInfo,_std::allocator<adios2::core::engine::ssc::BlockInfo>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = pvVar2;
    }
    std::
    vector<std::vector<adios2::core::engine::ssc::BlockInfo,_std::allocator<adios2::core::engine::ssc::BlockInfo>_>,_std::allocator<std::vector<adios2::core::engine::ssc::BlockInfo,_std::allocator<adios2::core::engine::ssc::BlockInfo>_>_>_>
    ::resize(&this->m_GlobalWritePattern,(long)(this->super_SscWriterBase).m_StreamSize);
    pvVar2 = (this->m_GlobalReadPattern).
             super__Vector_base<std::vector<adios2::core::engine::ssc::BlockInfo,_std::allocator<adios2::core::engine::ssc::BlockInfo>_>,_std::allocator<std::vector<adios2::core::engine::ssc::BlockInfo,_std::allocator<adios2::core::engine::ssc::BlockInfo>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pvVar3 = (this->m_GlobalReadPattern).
             super__Vector_base<std::vector<adios2::core::engine::ssc::BlockInfo,_std::allocator<adios2::core::engine::ssc::BlockInfo>_>,_std::allocator<std::vector<adios2::core::engine::ssc::BlockInfo,_std::allocator<adios2::core::engine::ssc::BlockInfo>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    pvVar5 = pvVar2;
    if (pvVar3 != pvVar2) {
      do {
        std::
        vector<adios2::core::engine::ssc::BlockInfo,_std::allocator<adios2::core::engine::ssc::BlockInfo>_>
        ::~vector(pvVar5);
        pvVar5 = pvVar5 + 1;
      } while (pvVar5 != pvVar3);
      (this->m_GlobalReadPattern).
      super__Vector_base<std::vector<adios2::core::engine::ssc::BlockInfo,_std::allocator<adios2::core::engine::ssc::BlockInfo>_>,_std::allocator<std::vector<adios2::core::engine::ssc::BlockInfo,_std::allocator<adios2::core::engine::ssc::BlockInfo>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = pvVar2;
    }
    std::
    vector<std::vector<adios2::core::engine::ssc::BlockInfo,_std::allocator<adios2::core::engine::ssc::BlockInfo>_>,_std::allocator<std::vector<adios2::core::engine::ssc::BlockInfo,_std::allocator<adios2::core::engine::ssc::BlockInfo>_>_>_>
    ::resize(&this->m_GlobalReadPattern,(long)(this->super_SscWriterBase).m_StreamSize);
  }
  if (1 < (this->super_SscWriterBase).m_CurrentStep) {
    if ((this->m_WriterDefinitionsLocked == true) && (this->m_ReaderSelectionsLocked == true)) {
      ppoVar4 = (this->m_MpiRequests).
                super__Vector_base<ompi_request_t_*,_std::allocator<ompi_request_t_*>_>._M_impl.
                super__Vector_impl_data._M_start;
      MPI_Waitall((ulong)((long)(this->m_MpiRequests).
                                super__Vector_base<ompi_request_t_*,_std::allocator<ompi_request_t_*>_>
                                ._M_impl.super__Vector_impl_data._M_finish - (long)ppoVar4) >> 3,
                  ppoVar4,0);
      ppoVar4 = (this->m_MpiRequests).
                super__Vector_base<ompi_request_t_*,_std::allocator<ompi_request_t_*>_>._M_impl.
                super__Vector_impl_data._M_start;
      if ((this->m_MpiRequests).
          super__Vector_base<ompi_request_t_*,_std::allocator<ompi_request_t_*>_>._M_impl.
          super__Vector_impl_data._M_finish != ppoVar4) {
        (this->m_MpiRequests).
        super__Vector_base<ompi_request_t_*,_std::allocator<ompi_request_t_*>_>._M_impl.
        super__Vector_impl_data._M_finish = ppoVar4;
      }
    }
    else {
      MPI_Win_free(&this->m_MpiWin);
    }
  }
  return OK;
}

Assistant:

StepStatus SscWriterGeneric::BeginStep(const StepMode mode, const float timeoutSeconds,
                                       const bool writerLocked)
{

    m_WriterDefinitionsLocked = writerLocked;

    if (m_Threading && m_EndStepThread.joinable())
    {
        m_EndStepThread.join();
    }

    ++m_CurrentStep;

    if (m_CurrentStep == 0 || m_WriterDefinitionsLocked == false ||
        m_ReaderSelectionsLocked == false)
    {
        m_Buffer.resize(1);
        m_Buffer[0] = 0;
        m_GlobalWritePattern.clear();
        m_GlobalWritePattern.resize(m_StreamSize);
        m_GlobalReadPattern.clear();
        m_GlobalReadPattern.resize(m_StreamSize);
    }

    if (m_CurrentStep > 1)
    {
        if (m_WriterDefinitionsLocked && m_ReaderSelectionsLocked)
        {
            MPI_Waitall(static_cast<int>(m_MpiRequests.size()), m_MpiRequests.data(),
                        MPI_STATUSES_IGNORE);
            m_MpiRequests.clear();
        }
        else
        {
            MPI_Win_free(&m_MpiWin);
        }
    }

    return StepStatus::OK;
}